

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

uint32_t cfd::core::CalculateRangeProofSize(int64_t amount,int exponent,int minimum_bits)

{
  uint32_t uVar1;
  size_t sVar2;
  uint32_t rangeproof_size;
  int minimum_bits_local;
  int exponent_local;
  Script local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> range_proof;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commitment;
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_factor;
  ByteData256 key_data;
  ByteData vbf_data;
  Privkey privkey;
  ConfidentialAssetId asset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  minimum_bits_local = minimum_bits;
  exponent_local = exponent;
  ::std::__cxx11::string::string
            ((string *)&local_160,"e863b2791be1be9659a940123143f210b9760a3b85862bf0833ef27c80c83816"
             ,(allocator *)&asset);
  ByteData::ByteData(&vbf_data,(string *)&local_160);
  ::std::__cxx11::string::~string((string *)&local_160);
  ::std::__cxx11::string::string
            ((string *)&local_160,"7df80e5705518368f2e1598e177f4929ba5ab54ab8177582dcc7504fc333c84e"
             ,(allocator *)&asset);
  ByteData256::ByteData256(&key_data,(string *)&local_160);
  ::std::__cxx11::string::~string((string *)&local_160);
  ::std::__cxx11::string::string
            ((string *)&local_160,"3668f9bdc8f1cc9c1a0247613fffa17b18e3141898e011386b831709c518d805"
             ,(allocator *)&privkey);
  ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&local_160);
  ::std::__cxx11::string::~string((string *)&local_160);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_factor,0x20,
             (allocator_type *)&local_160);
  ByteData::GetBytes(&vbf,&vbf_data);
  Privkey::Privkey(&privkey,&key_data,kMainnet,true);
  commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Script::Script(&local_160);
  CalculateRangeProof((ByteData *)&local_40,amount,(Pubkey *)0x0,&privkey,&asset,&empty_factor,&vbf,
                      &local_160,1,exponent,minimum_bits,&commitment,&range_proof);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  Script::~Script(&local_160);
  ByteData::ByteData((ByteData *)&local_160,&range_proof);
  sVar2 = ByteData::GetSerializeSize((ByteData *)&local_160);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_160);
  rangeproof_size = (uint32_t)sVar2;
  local_160._vptr_Script = (_func_int **)0x51d96b;
  local_160.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xe2;
  local_160.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CalculateRangeProofSize";
  logger::info<int&,int&,unsigned_int&>
            ((CfdSourceLocation *)&local_160,"[{},{}] rangeproof_size[{}]",&exponent_local,
             &minimum_bits_local,&rangeproof_size);
  uVar1 = rangeproof_size;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vbf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ConfidentialAssetId::~ConfidentialAssetId(&asset);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key_data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&vbf_data);
  return uVar1;
}

Assistant:

static uint32_t CalculateRangeProofSize(
    int64_t amount, int exponent, int minimum_bits) {
  // dummy value
  ByteData vbf_data(
      "e863b2791be1be9659a940123143f210b9760a3b85862bf0833ef27c80c83816");
  ByteData256 key_data(
      "7df80e5705518368f2e1598e177f4929ba5ab54ab8177582dcc7504fc333c84e");
  ConfidentialAssetId asset(
      "3668f9bdc8f1cc9c1a0247613fffa17b18e3141898e011386b831709c518d805");
  std::vector<uint8_t> empty_factor(kBlindFactorSize);
  std::vector<uint8_t> vbf = vbf_data.GetBytes();
  Privkey privkey(key_data);
  std::vector<uint8_t> commitment;
  std::vector<uint8_t> range_proof;
  uint64_t value = static_cast<uint64_t>(amount);
  CalculateRangeProof(
      value, nullptr, privkey, asset, empty_factor, vbf, Script(), 1, exponent,
      minimum_bits, &commitment, &range_proof);
  uint32_t rangeproof_size =
      static_cast<uint32_t>(ByteData(range_proof).GetSerializeSize());
  info(
      CFD_LOG_SOURCE, "[{},{}] rangeproof_size[{}]", exponent, minimum_bits,
      rangeproof_size);
  return rangeproof_size;
}